

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall Assimp::AssbinChunkWriter::~AssbinChunkWriter(AssbinChunkWriter *this)

{
  AssbinChunkWriter *this_local;
  
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00f3d458;
  if (this->container != (IOStream *)0x0) {
    (*this->container->_vptr_IOStream[3])(this->container,&this->magic,4,1);
    (*this->container->_vptr_IOStream[3])(this->container,&this->cursor,4,1);
    (*this->container->_vptr_IOStream[3])(this->container,this->buffer,1,this->cursor);
  }
  if ((this->buffer != (uint8_t *)0x0) && (this->buffer != (uint8_t *)0x0)) {
    operator_delete__(this->buffer);
  }
  IOStream::~IOStream(&this->super_IOStream);
  return;
}

Assistant:

virtual ~AssbinChunkWriter()
    {
        if (container) {
            container->Write( &magic, sizeof(uint32_t), 1 );
            container->Write( &cursor, sizeof(uint32_t), 1 );
            container->Write( buffer, 1, cursor );
        }
        if (buffer) delete[] buffer;
    }